

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

objdef * objexp(mcmcxdef *ctx,objnum obj,ushort *siz)

{
  ushort uVar1;
  uchar *puVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  short sVar4;
  ulong uVar5;
  
  uVar5 = CONCAT62(in_register_00000032,obj) >> 8 & 0xffffff;
  uVar3 = (ulong)(((uint)CONCAT62(in_register_00000032,obj) & 0xff) * 2);
  uVar1 = *(ushort *)((long)ctx->mcmcxmtb[uVar5] + uVar3);
  sVar4 = (short)*(undefined4 *)
                  ((long)&ctx->mcmcxgl->mcmcxtab[uVar1 >> 8]->mcmosiz + (ulong)((uVar1 & 0xff) << 5)
                  );
  puVar2 = mcmrealo(ctx,obj,*siz + sVar4);
  uVar1 = *(ushort *)((long)ctx->mcmcxmtb[uVar5] + uVar3);
  *siz = (short)*(undefined4 *)
                 ((long)&ctx->mcmcxgl->mcmcxtab[uVar1 >> 8]->mcmosiz + (ulong)((uVar1 & 0xff) << 5))
         - sVar4;
  return puVar2;
}

Assistant:

objdef *objexp(mcmcxdef *ctx, objnum obj, ushort *siz)
{
    ushort  oldsiz;
    uchar  *p;
    
    oldsiz = mcmobjsiz(ctx, (mcmon)obj);
    p = mcmrealo(ctx, (mcmon)obj, (ushort)(oldsiz + *siz));
    *siz = mcmobjsiz(ctx, (mcmon)obj) - oldsiz;
    return((objdef *)p);
}